

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IcePoint.cpp
# Opt level: O0

Point * __thiscall IceMaths::Point::UnitRandomVector(Point *this)

{
  udword uVar1;
  float fVar2;
  Point *this_local;
  float M;
  
  uVar1 = Rand();
  this->x = (float)uVar1 * 4.656613e-10 - 0.5;
  uVar1 = Rand();
  this->y = (float)uVar1 * 4.656613e-10 - 0.5;
  uVar1 = Rand();
  this->z = (float)uVar1 * 4.656613e-10 - 0.5;
  fVar2 = this->z * this->z + this->x * this->x + this->y * this->y;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = sqrtf(fVar2);
    fVar2 = 1.0 / fVar2;
    this->x = fVar2 * this->x;
    this->y = fVar2 * this->y;
    this->z = fVar2 * this->z;
  }
  return this;
}

Assistant:

Point& Point::UnitRandomVector()
{
	x = UnitRandomFloat() - 0.5f;
	y = UnitRandomFloat() - 0.5f;
	z = UnitRandomFloat() - 0.5f;
	Normalize();
	return *this;
}